

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QCache<QString,_QConfFile>::Node>::erase
          (Span<QCache<QString,_QConfFile>::Node> *this,size_t bucket)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  long in_RSI;
  Node *in_RDI;
  uchar entry;
  
  bVar1 = *(byte *)((long)&(in_RDI->super_Chain).prev + in_RSI);
  *(undefined1 *)((long)&(in_RDI->super_Chain).prev + in_RSI) = 0xff;
  Entry::node((Entry *)((long)in_RDI[2].key.d.d + (ulong)bVar1 * 0x38));
  QCache<QString,_QConfFile>::Node::~Node(in_RDI);
  uVar2 = *(uchar *)((long)&in_RDI[2].key.d.ptr + 1);
  puVar3 = Entry::nextFree((Entry *)((long)in_RDI[2].key.d.d + (ulong)bVar1 * 0x38));
  *puVar3 = uVar2;
  *(byte *)((long)&in_RDI[2].key.d.ptr + 1) = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }